

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SetExprBinsSelectExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
          (BumpAllocator *this,Expression *args,Expression **args_1)

{
  Expression *matchesExpr;
  Expression *in_RDX;
  SetExprBinsSelectExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  matchesExpr = (Expression *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::ast::SetExprBinsSelectExpr::SetExprBinsSelectExpr(in_RSI,in_RDX,matchesExpr);
  return (SetExprBinsSelectExpr *)matchesExpr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }